

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::Options::OutputOptionParser::parseIntoConfig
          (OutputOptionParser *this,Command *cmd,ConfigData *config)

{
  pointer pbVar1;
  pointer pcVar2;
  long lVar3;
  long *plVar4;
  long *local_68 [2];
  long local_58 [2];
  long *local_48 [2];
  long local_38 [2];
  
  pbVar1 = (cmd->m_args).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar2 = (pbVar1->_M_dataplus)._M_p;
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,pcVar2,pcVar2 + pbVar1->_M_string_length);
  lVar3 = *local_68[0];
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  if ((char)lVar3 == '%') {
    pbVar1 = (cmd->m_args).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar2 = (pbVar1->_M_dataplus)._M_p;
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,pcVar2,pcVar2 + pbVar1->_M_string_length);
    std::__cxx11::string::substr((ulong)local_68,(ulong)local_48);
    std::__cxx11::string::operator=((string *)&config->stream,(string *)local_68);
    if (local_68[0] != local_58) {
      operator_delete(local_68[0],local_58[0] + 1);
    }
    local_58[0] = local_38[0];
    plVar4 = local_48[0];
    if (local_48[0] == local_38) {
      return;
    }
  }
  else {
    pbVar1 = (cmd->m_args).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar2 = (pbVar1->_M_dataplus)._M_p;
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_68,pcVar2,pcVar2 + pbVar1->_M_string_length);
    std::__cxx11::string::operator=((string *)&config->outputFilename,(string *)local_68);
    plVar4 = local_68[0];
    if (local_68[0] == local_58) {
      return;
    }
  }
  operator_delete(plVar4,local_58[0] + 1);
  return;
}

Assistant:

virtual void parseIntoConfig( const Command& cmd, ConfigData& config ) {
                if( cmd[0][0] == '%' )
                    config.stream = cmd[0].substr( 1 );
                else
                    config.outputFilename = cmd[0];
            }